

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_true_output(void)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 local_175;
  undefined4 local_174;
  bool result;
  undefined7 uStack_16f;
  char *local_168;
  char input [5];
  reader reader;
  
  builtin_strncpy(input,"true",5);
  _result = strlen(input);
  local_168 = input;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,(view_type *)&result);
  _result = CONCAT44(uStack_16f._3_4_,reader.decoder.current.code);
  local_174 = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x55,"void basic_suite::test_true_output()",&result,&local_174);
  if (reader.decoder.current.code == true_value) {
    uVar1 = 1;
  }
  else {
    if (reader.decoder.current.code != false_value) goto LAB_00102d5f;
    uVar1 = 0;
  }
  _result = CONCAT71(uStack_16f,uVar1);
LAB_00102d5f:
  local_174._0_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x58,"void basic_suite::test_true_output()",&result,&local_174);
  bVar2 = trial::protocol::json::basic_reader<char>::next(&reader);
  local_174 = CONCAT31(local_174._1_3_,bVar2);
  local_175 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x59,"void basic_suite::test_true_output()",&local_174,&local_175);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void test_true_output()
{
    const char input[] = "true";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    bool result;
    TRIAL_PROTOCOL_TEST_NO_THROW(reader.value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}